

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::ConditionalJumpPattern::TryToGenerateCode
          (ConditionalJumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TLogicOperator TVar1;
  CExpression *pCVar2;
  CTemp *pCVar3;
  CLabelStatement *pCVar4;
  CTempExpression *local_2c0;
  ConstTempPtr local_2b0;
  CJumpConditionalStatement *local_2a0;
  CLabel local_290;
  CLabel local_270;
  undefined1 local_250 [48];
  CLabel local_220;
  undefined1 local_200 [48];
  CLabel local_1d0;
  undefined1 local_1b0 [48];
  CLabel local_180;
  undefined1 local_160 [16];
  CExpression *local_150;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_148;
  pair<IRT::CTemp,_const_IRT::INode_*> local_120;
  CExpression *local_f8;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_f0;
  pair<IRT::CTemp,_const_IRT::INode_*> local_c8;
  CTempExpression *local_a0;
  ConstTempPtr rightTemp;
  ConstTempPtr leftTemp;
  undefined1 local_80 [8];
  CTemp rightOperand;
  CTemp leftOperand;
  ConstCJumpPtr cJumpPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  ConditionalJumpPattern *this_local;
  
  if (tree == (INode *)0x0) {
    local_2a0 = (CJumpConditionalStatement *)0x0;
  }
  else {
    local_2a0 = (CJumpConditionalStatement *)
                __dynamic_cast(tree,&INode::typeinfo,&CJumpConditionalStatement::typeinfo,0);
  }
  if (local_2a0 == (CJumpConditionalStatement *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    CTemp::CTemp((CTemp *)&rightOperand.field_0x18);
    CTemp::CTemp((CTemp *)local_80);
    pCVar2 = CJumpConditionalStatement::LeftOperand(local_2a0);
    if (pCVar2 == (CExpression *)0x0) {
      local_2b0 = (ConstTempPtr)0x0;
    }
    else {
      local_2b0 = (ConstTempPtr)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    rightTemp = local_2b0;
    pCVar2 = CJumpConditionalStatement::RightOperand(local_2a0);
    if (pCVar2 == (CExpression *)0x0) {
      local_2c0 = (CTempExpression *)0x0;
    }
    else {
      local_2c0 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    local_a0 = local_2c0;
    if (rightTemp == (ConstTempPtr)0x0) {
      local_f8 = CJumpConditionalStatement::LeftOperand(local_2a0);
      std::make_pair<IRT::CTemp&,IRT::CExpression_const*>
                (&local_f0,(CTemp *)&rightOperand.field_0x18,&local_f8);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&local_c8,&local_f0);
      std::
      vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
      ::push_back(children,&local_c8);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_c8);
      std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_f0);
    }
    else {
      pCVar3 = CTempExpression::getTemprorary(rightTemp);
      CTemp::operator=((CTemp *)&rightOperand.field_0x18,pCVar3);
    }
    if (local_a0 == (CTempExpression *)0x0) {
      local_150 = CJumpConditionalStatement::RightOperand(local_2a0);
      std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_148,(CTemp *)local_80,&local_150);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&local_120,&local_148);
      std::
      vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
      ::push_back(children,&local_120);
      std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_120);
      std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_148);
    }
    else {
      pCVar3 = CTempExpression::getTemprorary(local_a0);
      CTemp::operator=((CTemp *)local_80,pCVar3);
    }
    TVar1 = CJumpConditionalStatement::Operation(local_2a0);
    switch(TVar1) {
    case EQUALS:
      pCVar4 = CJumpConditionalStatement::TrueLabel(local_2a0);
      CLabelStatement::Label((CLabel *)(local_250 + 0x10),pCVar4);
      CLabel::ToString_abi_cxx11_(&local_220);
      std::make_shared<AssemblyCode::CJumpEqualCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                ((CTemp *)local_200,(CTemp *)&rightOperand.field_0x18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpEqualCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpEqualCommand> *)local_200);
      std::shared_ptr<AssemblyCode::CJumpEqualCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::CJumpEqualCommand> *)local_200);
      std::__cxx11::string::~string((string *)&local_220);
      CLabel::~CLabel((CLabel *)(local_250 + 0x10));
      break;
    case NOT_EQUALS:
      pCVar4 = CJumpConditionalStatement::TrueLabel(local_2a0);
      CLabelStatement::Label(&local_290,pCVar4);
      CLabel::ToString_abi_cxx11_(&local_270);
      std::
      make_shared<AssemblyCode::CJumpNotEqualCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                ((CTemp *)local_250,(CTemp *)&rightOperand.field_0x18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpNotEqualCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpNotEqualCommand> *)local_250);
      std::shared_ptr<AssemblyCode::CJumpNotEqualCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::CJumpNotEqualCommand> *)local_250);
      std::__cxx11::string::~string((string *)&local_270);
      CLabel::~CLabel(&local_290);
      break;
    case LESS:
      pCVar4 = CJumpConditionalStatement::TrueLabel(local_2a0);
      CLabelStatement::Label((CLabel *)(local_1b0 + 0x10),pCVar4);
      CLabel::ToString_abi_cxx11_(&local_180);
      std::make_shared<AssemblyCode::CJumpLessCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                ((CTemp *)local_160,(CTemp *)&rightOperand.field_0x18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)local_160);
      std::shared_ptr<AssemblyCode::CJumpLessCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::CJumpLessCommand> *)local_160);
      std::__cxx11::string::~string((string *)&local_180);
      CLabel::~CLabel((CLabel *)(local_1b0 + 0x10));
      break;
    case GREATER:
      pCVar4 = CJumpConditionalStatement::TrueLabel(local_2a0);
      CLabelStatement::Label((CLabel *)(local_200 + 0x10),pCVar4);
      CLabel::ToString_abi_cxx11_(&local_1d0);
      std::make_shared<AssemblyCode::CJumpLessCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                ((CTemp *)local_1b0,(CTemp *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &rightOperand.field_0x18);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)local_1b0);
      std::shared_ptr<AssemblyCode::CJumpLessCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::CJumpLessCommand> *)local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      CLabel::~CLabel((CLabel *)(local_200 + 0x10));
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/TreePatterns.cpp"
                    ,0x146,
                    "virtual bool IRT::ConditionalJumpPattern::TryToGenerateCode(const IRT::INode *, const IRT::CTemp &, ChildrenTemps &, AssemblyCommands &)"
                   );
    }
    this_local._7_1_ = true;
    CTemp::~CTemp((CTemp *)local_80);
    CTemp::~CTemp((CTemp *)&rightOperand.field_0x18);
  }
  return this_local._7_1_;
}

Assistant:

bool
IRT::ConditionalJumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                                AssemblyCommands &commands ) {
    ConstCJumpPtr cJumpPtr = dynamic_cast<ConstCJumpPtr>(tree);
    if ( cJumpPtr ) {
        CTemp leftOperand;
        CTemp rightOperand;
        ConstTempPtr leftTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->LeftOperand( ));
        ConstTempPtr rightTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->RightOperand( ));
        if ( !leftTemp ) {
            children.push_back( std::make_pair( leftOperand, cJumpPtr->LeftOperand( )));
        } else {
            leftOperand = leftTemp->getTemprorary( );
        }
        if ( !rightTemp ) {
            children.push_back( std::make_pair( rightOperand, cJumpPtr->RightOperand( )));
        } else {
            rightOperand = rightTemp->getTemprorary( );
        }
        switch ( cJumpPtr->Operation( )) {
            case IRT::enums::TLogicOperator::LESS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( leftOperand, rightOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::GREATER : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( rightOperand, leftOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpEqualCommand>( leftOperand, rightOperand,
                                                                                          cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::NOT_EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpNotEqualCommand>( leftOperand, rightOperand,
                                                                                             cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            default: {
                assert( false );
            }
        }
        return true;
    }
    return false;
}